

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O0

void __thiscall num_parse_test_parse_float_Test::TestBody(num_parse_test_parse_float_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_a0;
  Message local_98;
  double local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  double local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48 [3];
  double local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  float resf32;
  uint32_t f_as_ui;
  num_parse_test_parse_float_Test *this_local;
  
  gtest_ar.message_.ptr_._4_4_ = 0x3fc00000;
  gtest_ar.message_.ptr_._0_4_ =
       mvm::num::parse<float,4ul,mvm::num::little_endian_tag>
                 ((uint8_t *)((long)&gtest_ar.message_.ptr_ + 4));
  local_30 = 1.5;
  testing::internal::EqHelper<false>::Compare<float,double>
            ((EqHelper<false> *)local_28,"resf32","1.5",(float *)&gtest_ar.message_,&local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  gtest_ar.message_.ptr_._4_4_ = 0x3f900000;
  gtest_ar.message_.ptr_._0_4_ =
       mvm::num::parse<float,4ul,mvm::num::little_endian_tag>
                 ((uint8_t *)((long)&gtest_ar.message_.ptr_ + 4));
  local_68 = 1.125;
  testing::internal::EqHelper<false>::Compare<float,double>
            ((EqHelper<false> *)local_60,"resf32","1.125",(float *)&gtest_ar.message_,&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  gtest_ar.message_.ptr_._4_4_ = 0xc0100000;
  gtest_ar.message_.ptr_._0_4_ =
       mvm::num::parse<float,4ul,mvm::num::little_endian_tag>
                 ((uint8_t *)((long)&gtest_ar.message_.ptr_ + 4));
  local_90 = -2.25;
  testing::internal::EqHelper<false>::Compare<float,double>
            ((EqHelper<false> *)local_88,"resf32","-2.25",(float *)&gtest_ar.message_,&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  return;
}

Assistant:

TEST(num_parse_test, parse_float) {
  uint32_t f_as_ui = 0x3fc00000; // 1.5
  auto resf32 = parse<float, sizeof(float), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&f_as_ui));
  EXPECT_EQ(resf32, 1.5);

  f_as_ui = 0x3f900000; // 1.125
  resf32 = parse<float, sizeof(float), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&f_as_ui));
  EXPECT_EQ(resf32, 1.125);

  f_as_ui = 0xc0100000; // -2.25
  resf32 = parse<float, sizeof(float), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&f_as_ui));
  EXPECT_EQ(resf32, -2.25);
}